

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recorder.cpp
# Opt level: O3

void __thiscall
helics::apps::Recorder::addDestEndpointClone(Recorder *this,string_view destEndpoint)

{
  element_type *peVar1;
  CloningFilter *pCVar2;
  Endpoint *pEVar3;
  CloningFilter *pCVar4;
  Endpoint *this_00;
  string *psVar5;
  MessageFederate *mFed;
  Interface *this_01;
  Federate *ffed;
  string_view endpoint;
  string_view name;
  
  this_01 = (Interface *)
            (this->cFilt)._M_t.
            super___uniq_ptr_impl<helics::CloningFilter,_std::default_delete<helics::CloningFilter>_>
            ._M_t.
            super__Tuple_impl<0UL,_helics::CloningFilter_*,_std::default_delete<helics::CloningFilter>_>
            .super__Head_base<0UL,_helics::CloningFilter_*,_false>._M_head_impl;
  if (this_01 == (Interface *)0x0) {
    peVar1 = (this->super_App).fed.
             super___shared_ptr<helics::CombinationFederate,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    pCVar4 = (CloningFilter *)operator_new(0x50);
    if (peVar1 == (element_type *)0x0) {
      ffed = (Federate *)0x0;
    }
    else {
      ffed = (Federate *)
             ((long)&(peVar1->super_ValueFederate)._vptr_ValueFederate +
             (long)(peVar1->super_ValueFederate)._vptr_ValueFederate[-3]);
    }
    CloningFilter::CloningFilter(pCVar4,ffed,(string_view)ZEXT816(0));
    pCVar2 = (this->cFilt)._M_t.
             super___uniq_ptr_impl<helics::CloningFilter,_std::default_delete<helics::CloningFilter>_>
             ._M_t.
             super__Tuple_impl<0UL,_helics::CloningFilter_*,_std::default_delete<helics::CloningFilter>_>
             .super__Head_base<0UL,_helics::CloningFilter_*,_false>._M_head_impl;
    (this->cFilt)._M_t.
    super___uniq_ptr_impl<helics::CloningFilter,_std::default_delete<helics::CloningFilter>_>._M_t.
    super__Tuple_impl<0UL,_helics::CloningFilter_*,_std::default_delete<helics::CloningFilter>_>.
    super__Head_base<0UL,_helics::CloningFilter_*,_false>._M_head_impl = pCVar4;
    if (pCVar2 != (CloningFilter *)0x0) {
      (**(code **)(*(long *)&(pCVar2->super_Filter).super_Interface + 8))();
    }
    peVar1 = (this->super_App).fed.
             super___shared_ptr<helics::CombinationFederate,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    this_00 = (Endpoint *)operator_new(0x78);
    mFed = (MessageFederate *)&(peVar1->super_ValueFederate).field_0x10;
    if (peVar1 == (element_type *)0x0) {
      mFed = (MessageFederate *)0x0;
    }
    name._M_str = "cloneE";
    name._M_len = 6;
    Endpoint::Endpoint(this_00,mFed,name,(string_view)ZEXT816(0));
    pEVar3 = (this->cloneEndpoint)._M_t.
             super___uniq_ptr_impl<helics::Endpoint,_std::default_delete<helics::Endpoint>_>._M_t.
             super__Tuple_impl<0UL,_helics::Endpoint_*,_std::default_delete<helics::Endpoint>_>.
             super__Head_base<0UL,_helics::Endpoint_*,_false>._M_head_impl;
    (this->cloneEndpoint)._M_t.
    super___uniq_ptr_impl<helics::Endpoint,_std::default_delete<helics::Endpoint>_>._M_t.
    super__Tuple_impl<0UL,_helics::Endpoint_*,_std::default_delete<helics::Endpoint>_>.
    super__Head_base<0UL,_helics::Endpoint_*,_false>._M_head_impl = this_00;
    if (pEVar3 != (Endpoint *)0x0) {
      (**(code **)((long)(pEVar3->super_Interface)._vptr_Interface + 8))();
      this_00 = (this->cloneEndpoint)._M_t.
                super___uniq_ptr_impl<helics::Endpoint,_std::default_delete<helics::Endpoint>_>._M_t
                .super__Tuple_impl<0UL,_helics::Endpoint_*,_std::default_delete<helics::Endpoint>_>.
                super__Head_base<0UL,_helics::Endpoint_*,_false>._M_head_impl;
    }
    pCVar4 = (this->cFilt)._M_t.
             super___uniq_ptr_impl<helics::CloningFilter,_std::default_delete<helics::CloningFilter>_>
             ._M_t.
             super__Tuple_impl<0UL,_helics::CloningFilter_*,_std::default_delete<helics::CloningFilter>_>
             .super__Head_base<0UL,_helics::CloningFilter_*,_false>._M_head_impl;
    psVar5 = Interface::getName_abi_cxx11_(&this_00->super_Interface);
    endpoint._M_str = (psVar5->_M_dataplus)._M_p;
    endpoint._M_len = psVar5->_M_string_length;
    CloningFilter::addDeliveryEndpoint(pCVar4,endpoint);
    this_01 = (Interface *)
              (this->cFilt)._M_t.
              super___uniq_ptr_impl<helics::CloningFilter,_std::default_delete<helics::CloningFilter>_>
              ._M_t.
              super__Tuple_impl<0UL,_helics::CloningFilter_*,_std::default_delete<helics::CloningFilter>_>
              .super__Head_base<0UL,_helics::CloningFilter_*,_false>._M_head_impl;
  }
  Interface::addDestinationTarget(this_01,(string_view)destEndpoint,UNKNOWN);
  return;
}

Assistant:

void Recorder::addDestEndpointClone(std::string_view destEndpoint)
{
    if (!cFilt) {
        cFilt = std::make_unique<CloningFilter>(fed.get());
        cloneEndpoint = std::make_unique<Endpoint>(fed.get(), "cloneE");
        cFilt->addDeliveryEndpoint(cloneEndpoint->getName());
    }
    cFilt->addDestinationTarget(destEndpoint);
}